

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O3

int x509_d2i_cb(ASN1_VALUE **pval,uchar **in,long len,ASN1_ITEM *it,int opt,ASN1_TLC *ctx)

{
  int iVar1;
  X509 *pXVar2;
  CBS cbs;
  CBS local_30;
  
  if (len < 0) {
    iVar1 = 0;
    ERR_put_error(0xc,0,0x6b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_x509.cc"
                  ,0x100);
  }
  else {
    local_30.data = *in;
    local_30.len = len;
    if ((opt != 0) && (iVar1 = CBS_peek_asn1_tag(&local_30,0x20000010), iVar1 == 0)) {
      return -1;
    }
    iVar1 = 0;
    pXVar2 = x509_parse(&local_30,(CRYPTO_BUFFER *)0x0);
    if (pXVar2 != (X509 *)0x0) {
      *in = local_30.data;
      X509_free((X509 *)*pval);
      *pval = (ASN1_VALUE *)pXVar2;
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int x509_d2i_cb(ASN1_VALUE **pval, const unsigned char **in, long len,
                       const ASN1_ITEM *it, int opt, ASN1_TLC *ctx) {
  if (len < 0) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_BUFFER_TOO_SMALL);
    return 0;
  }

  CBS cbs;
  CBS_init(&cbs, *in, len);
  if (opt && !CBS_peek_asn1_tag(&cbs, CBS_ASN1_SEQUENCE)) {
    return -1;
  }

  X509 *ret = x509_parse(&cbs, NULL);
  if (ret == NULL) {
    return 0;
  }

  *in = CBS_data(&cbs);
  X509_free((X509 *)*pval);
  *pval = (ASN1_VALUE *)ret;
  return 1;
}